

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

VARR_token_t * do_concat(c2m_ctx_t c2m_ctx,VARR_token_t *tokens)

{
  short sVar1;
  ushort uVar2;
  token_t *pptVar3;
  token_t ptVar4;
  VARR_char *pVVar5;
  undefined8 uVar6;
  VARR_stream_t *pVVar7;
  size_t sVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  token_t ptVar12;
  token_t ptVar13;
  ulong uVar14;
  ulong uVar15;
  VARR_token_t *pVVar16;
  char *pcVar17;
  uint uVar18;
  MIR_context_t pMVar19;
  VARR_token_t *pVVar20;
  MIR_context_t pMVar21;
  undefined8 *extraout_RDX;
  VARR_token_t *pVVar22;
  uint uVar23;
  VARR_token_t *pVVar24;
  long lVar25;
  c2mir_options *pcVar26;
  str_t sVar27;
  c2m_ctx_t c2m_ctx_00;
  
  pVVar22 = tokens;
  c2m_ctx_00 = c2m_ctx;
  if (tokens != (VARR_token_t *)0x0) {
    pVVar16 = (VARR_token_t *)tokens->els_num;
    if (0 < (int)pVVar16) {
      pVVar20 = (VARR_token_t *)((ulong)pVVar16 & 0xffffffff);
      do {
        pptVar3 = tokens->varr;
        if (pptVar3 == (token_t *)0x0) goto LAB_001927ae;
        iVar11 = (int)pVVar20;
        pVVar24 = (VARR_token_t *)(ulong)(iVar11 - 1);
        if (pVVar16 <= pVVar24) goto LAB_001927ae;
        ptVar12 = pptVar3[(long)pVVar24];
        if (*(short *)ptVar12 == 0x142) {
          if ((iVar11 == 1) || (uVar18 = (uint)pVVar16, (int)uVar18 <= iVar11)) goto LAB_001927c2;
          if (pVVar16 <= pVVar20) {
            do_concat_cold_2();
LAB_0019280a:
            do_concat_cold_10();
LAB_0019280f:
            do_concat_cold_8();
LAB_00192814:
            do_concat_cold_7();
LAB_00192819:
            do_concat_cold_9();
LAB_0019281e:
            do_concat_cold_14();
LAB_00192823:
            __assert_fail("cs->f == NULL && cs->f == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x42a,"void remove_string_stream(c2m_ctx_t)");
          }
          if ((*(short *)pptVar3[(long)pVVar20] == 0x20) || (*(short *)pptVar3[(long)pVVar20] == 10)
             ) {
            pVVar20 = (VARR_token_t *)(ulong)(iVar11 + 1);
          }
          pVVar24 = (VARR_token_t *)(ulong)(iVar11 - 2);
          if (pVVar16 <= pVVar24) goto LAB_001927bd;
          if ((*(short *)pptVar3[(long)pVVar24] == 0x20) || (*(short *)pptVar3[(long)pVVar24] == 10)
             ) {
            pVVar24 = (VARR_token_t *)(ulong)(iVar11 - 3);
          }
          iVar11 = (int)pVVar24;
          if ((iVar11 < 0) || (uVar23 = (uint)pVVar20, uVar18 <= uVar23)) {
LAB_001927e6:
            __assert_fail("k >= 0 && j < len",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0xaae,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
          }
          if (pVVar16 <= pVVar20) goto LAB_001927b8;
          if (pVVar16 <= pVVar24) {
            do_concat_cold_5();
            goto LAB_001927e6;
          }
          ptVar13 = pptVar3[(long)pVVar20];
          ptVar4 = pptVar3[(long)pVVar24];
          sVar1 = *(short *)ptVar13;
          uVar2 = *(ushort *)ptVar4;
          pVVar22 = (VARR_token_t *)(ulong)uVar2;
          if ((sVar1 != 0x141) && (uVar2 != 0x141)) {
            pVVar5 = c2m_ctx->temp_string;
            if ((pVVar5 == (VARR_char *)0x0) || (pVVar5->varr == (char *)0x0)) goto LAB_0019280a;
            pVVar5->els_num = 0;
            add_to_temp_string(c2m_ctx,ptVar4->repr);
            add_to_temp_string(c2m_ctx,ptVar13->repr);
            reverse(c2m_ctx->temp_string);
            if (c2m_ctx->temp_string == (VARR_char *)0x0) goto LAB_00192819;
            set_string_stream(c2m_ctx,c2m_ctx->temp_string->varr,ptVar4->pos,
                              (_func_void_char_ptr_VARR_char_ptr *)0x0);
            ptVar12 = get_next_pptoken_1(c2m_ctx,0);
            do {
              ptVar13 = get_next_pptoken_1(c2m_ctx,0);
            } while (*(short *)ptVar13 == 0x147);
            if (*(short *)ptVar13 != 0x13d) {
              reverse(c2m_ctx->temp_string);
              uVar6._0_4_ = (ptVar4->pos).lno;
              uVar6._4_4_ = (ptVar4->pos).ln_pos;
              error(c2m_ctx,0x1c1a87,(ptVar4->pos).fname,uVar6);
              if (c2m_ctx->cs->f != (FILE *)0x0) goto LAB_00192823;
              pVVar7 = c2m_ctx->streams;
              if (((pVVar7 == (VARR_stream_t *)0x0) || (pVVar7->varr == (stream_t *)0x0)) ||
                 (sVar8 = pVVar7->els_num, sVar8 == 0)) goto LAB_0019280f;
              pVVar7->els_num = sVar8 - 1;
              free_stream(pVVar7->varr[sVar8 - 1]);
              pVVar7 = c2m_ctx->streams;
              if (((pVVar7 == (VARR_stream_t *)0x0) || (pVVar7->varr == (stream_t *)0x0)) ||
                 (pVVar7->els_num == 0)) goto LAB_00192814;
              c2m_ctx->cs = pVVar7->varr[pVVar7->els_num - 1];
            }
            c2m_ctx_00 = (c2m_ctx_t)tokens;
            del_tokens(tokens,iVar11 + 1,uVar23 - iVar11);
            if ((tokens->varr != (token_t *)0x0) &&
               (pVVar16 = (VARR_token_t *)tokens->els_num, pVVar24 < pVVar16)) {
              tokens->varr[(long)pVVar24] = ptVar12;
              goto LAB_0019275a;
            }
            goto LAB_001927b3;
          }
          if (sVar1 == 0x141) {
            uVar23 = uVar23 + 1;
            c2m_ctx_00 = (c2m_ctx_t)(ulong)uVar23;
            if (uVar18 <= uVar23) goto LAB_00192685;
            if ((VARR_token_t *)(ulong)uVar23 < pVVar16) {
              if ((*(short *)pptVar3[(long)(ulong)uVar23] == 0x20) ||
                 (*(short *)pptVar3[(long)(ulong)uVar23] == 10)) {
                pVVar20 = (VARR_token_t *)(ulong)uVar23;
              }
              goto LAB_00192685;
            }
LAB_00192847:
            do_concat_cold_11();
            goto LAB_0019284c;
          }
          pVVar20 = (VARR_token_t *)(ulong)(uVar23 - 1);
LAB_00192685:
          if (uVar2 == 0x141) {
            if (iVar11 == 0) {
              pVVar24 = (VARR_token_t *)0x0;
            }
            else {
              pVVar22 = (VARR_token_t *)(ulong)(iVar11 - 1U);
              if (pVVar16 <= pVVar22) {
                do_concat_cold_12();
                goto LAB_00192847;
              }
              if ((*(short *)pptVar3[(long)pVVar22] == 0x20) ||
                 (*(short *)pptVar3[(long)pVVar22] == 10)) {
                pVVar24 = (VARR_token_t *)(ulong)(iVar11 - 1U);
              }
            }
            if (sVar1 == 0x141) {
              del_tokens(tokens,(int)pVVar24,(int)pVVar20 - (int)pVVar24);
              pcVar17 = (ptVar12->pos).fname;
              iVar11 = (ptVar12->pos).lno;
              iVar10 = (ptVar12->pos).ln_pos;
              c2m_ctx_00 = c2m_ctx;
              ptVar12 = (token_t)reg_malloc(c2m_ctx,0x30);
              *(undefined4 *)ptVar12 = 0x20;
              (ptVar12->pos).fname = pcVar17;
              (ptVar12->pos).lno = iVar11;
              (ptVar12->pos).ln_pos = iVar10;
              ptVar12->repr = "";
              ptVar12->node_code = N_IGNORE;
              ptVar12->node = (node_t_conflict)0x0;
              if ((tokens->varr != (token_t *)0x0) &&
                 (pVVar16 = (VARR_token_t *)tokens->els_num, pVVar24 < pVVar16)) {
                tokens->varr[(long)pVVar24] = ptVar12;
                goto LAB_0019275a;
              }
              goto LAB_0019281e;
            }
          }
          else {
            pVVar24 = (VARR_token_t *)(ulong)(iVar11 + 1);
          }
          c2m_ctx_00 = (c2m_ctx_t)tokens;
          del_tokens(tokens,(int)pVVar24,((int)pVVar20 - (int)pVVar24) + 1);
          pVVar16 = (VARR_token_t *)tokens->els_num;
        }
LAB_0019275a:
        pVVar20 = pVVar24;
      } while (0 < (int)pVVar20);
      if (0 < (int)pVVar16) {
        uVar15 = (ulong)pVVar16 & 0xffffffff;
        do {
          uVar14 = uVar15 - 1;
          if ((tokens->varr == (token_t *)0x0) || (tokens->els_num <= uVar14)) {
            do_concat_cold_13();
LAB_001927ae:
            do_concat_cold_1();
LAB_001927b3:
            do_concat_cold_6();
LAB_001927b8:
            do_concat_cold_4();
LAB_001927bd:
            do_concat_cold_3();
LAB_001927c2:
            __assert_fail("k >= 0 && j < len",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0xaa9,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
          }
          *(undefined2 *)&tokens->varr[uVar14]->field_0x2 = 1;
          bVar9 = 1 < uVar15;
          uVar15 = uVar14;
        } while (bVar9);
      }
    }
    return tokens;
  }
LAB_0019284c:
  do_concat_cold_15();
  pVVar16 = (VARR_token_t *)c2m_ctx_00->env[0].__jmpbuf[0];
  if (pVVar16 != (VARR_token_t *)0x0) {
    pMVar21 = c2m_ctx_00->ctx;
    pMVar19 = (MIR_context_t)((long)&pMVar21->gen_ctx + 1);
    if ((MIR_context_t)c2m_ctx_00->options < pMVar19) {
      pcVar26 = (c2mir_options *)((long)&pMVar19->gen_ctx + ((ulong)pMVar19 >> 1));
      pVVar16 = (VARR_token_t *)realloc(pVVar16,(long)pcVar26 * 8);
      c2m_ctx_00->env[0].__jmpbuf[0] = (long)pVVar16;
      c2m_ctx_00->options = pcVar26;
      pMVar21 = c2m_ctx_00->ctx;
      pMVar19 = (MIR_context_t)((long)&pMVar21->gen_ctx + 1);
    }
    c2m_ctx_00->ctx = pMVar19;
    (&pVVar16->els_num)[(long)pMVar21] = (size_t)pVVar22;
    return pVVar16;
  }
  VARR_macro_call_tpush_cold_1();
  *extraout_RDX = 0;
  sVar1 = (short)pVVar22->els_num;
  if ((sVar1 != 0x102) && (sVar1 != 0x13e)) {
    __assert_fail("t->code == T_STR || t->code == T_HEADER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x99b,"const char *get_include_fname(c2m_ctx_t, token_t, const char **)");
  }
  pVVar16 = *(VARR_token_t **)(pVVar22[1].size + 0x20);
  if ((char)pVVar16->els_num != '/') {
    if (*(char *)pVVar22[1].varr == '\"') {
      pcVar17 = c2m_ctx_00->cs->fname;
      if (pcVar17 != (char *)0x0) {
        pcVar17 = get_full_name(c2m_ctx_00,pcVar17,(char *)pVVar16,0);
        iVar11 = file_found_p(pcVar17);
        if (iVar11 != 0) {
LAB_001929f9:
          sVar27 = uniq_cstr(c2m_ctx_00,pcVar17);
          return (VARR_token_t *)sVar27.s;
        }
      }
      pcVar17 = *c2m_ctx_00->header_dirs;
      if (pcVar17 != (char *)0x0) {
        lVar25 = 8;
        do {
          pcVar17 = get_full_name(c2m_ctx_00,pcVar17,(char *)pVVar16,1);
          iVar11 = file_found_p(pcVar17);
          if (iVar11 != 0) goto LAB_001929f9;
          pcVar17 = *(char **)((long)c2m_ctx_00->header_dirs + lVar25);
          lVar25 = lVar25 + 8;
        } while (pcVar17 != (char *)0x0);
      }
    }
    lVar25 = 8;
    do {
      if ((*(char **)(&UNK_001e3ce8 + lVar25) != (char *)0x0) &&
         (iVar11 = strcmp((char *)pVVar16,*(char **)(&UNK_001e3ce8 + lVar25)), iVar11 == 0)) {
        *extraout_RDX = *(undefined8 *)((long)&standard_includes[0].name + lVar25);
        return pVVar16;
      }
      lVar25 = lVar25 + 0x10;
    } while (lVar25 != 0xb8);
    pcVar17 = *c2m_ctx_00->system_header_dirs;
    if (pcVar17 != (char *)0x0) {
      lVar25 = 8;
      do {
        pcVar17 = get_full_name(c2m_ctx_00,pcVar17,(char *)pVVar16,1);
        iVar11 = file_found_p(pcVar17);
        if (iVar11 != 0) goto LAB_001929f9;
        pcVar17 = *(char **)((long)c2m_ctx_00->system_header_dirs + lVar25);
        lVar25 = lVar25 + 8;
      } while (pcVar17 != (char *)0x0);
    }
  }
  return pVVar16;
}

Assistant:

static VARR (token_t) * do_concat (c2m_ctx_t c2m_ctx, VARR (token_t) * tokens) {
  int i, j, k, empty_j_p, empty_k_p, len = (int) VARR_LENGTH (token_t, tokens);
  token_t t;

  for (i = len - 1; i >= 0; i--)
    if ((t = VARR_GET (token_t, tokens, i))->code == T_RDBLNO) {
      j = i + 1;
      k = i - 1;
      assert (k >= 0 && j < len);
      if (VARR_GET (token_t, tokens, j)->code == ' ' || VARR_GET (token_t, tokens, j)->code == '\n')
        j++;
      if (VARR_GET (token_t, tokens, k)->code == ' ' || VARR_GET (token_t, tokens, k)->code == '\n')
        k--;
      assert (k >= 0 && j < len);
      empty_j_p = VARR_GET (token_t, tokens, j)->code == T_PLM;
      empty_k_p = VARR_GET (token_t, tokens, k)->code == T_PLM;
      if (empty_j_p || empty_k_p) {
        if (!empty_j_p)
          j--;
        else if (j + 1 < len
                 && (VARR_GET (token_t, tokens, j + 1)->code == ' '
                     || VARR_GET (token_t, tokens, j + 1)->code == '\n'))
          j++;
        if (!empty_k_p)
          k++;
        else if (k != 0
                 && (VARR_GET (token_t, tokens, k - 1)->code == ' '
                     || VARR_GET (token_t, tokens, k - 1)->code == '\n'))
          k--;
        if (!empty_j_p || !empty_k_p) {
          del_tokens (tokens, k, j - k + 1);
        } else {
          del_tokens (tokens, k, j - k);
          t = new_token (c2m_ctx, t->pos, "", ' ', N_IGNORE);
          VARR_SET (token_t, tokens, k, t);
        }
      } else {
        t = token_concat (c2m_ctx, VARR_GET (token_t, tokens, k), VARR_GET (token_t, tokens, j));
        del_tokens (tokens, k + 1, j - k);
        VARR_SET (token_t, tokens, k, t);
      }
      i = k;
      len = (int) VARR_LENGTH (token_t, tokens);
    }
  for (i = len - 1; i >= 0; i--) VARR_GET (token_t, tokens, i)->processed_p = TRUE;
  return tokens;
}